

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

Promise<kj::AuthenticatedStream> __thiscall
kj::anon_unknown_0::FdConnectionReceiver::acceptImpl(FdConnectionReceiver *this,bool authenticated)

{
  _func_int **pp_Var1;
  UnixEventPort *eventPort;
  SourceLocation location;
  OwnPromiseNode OVar2;
  char cVar3;
  int iVar4;
  int *piVar5;
  void *pvVar6;
  AsyncStreamFd *this_00;
  char in_DL;
  undefined7 in_register_00000031;
  Disposer *pDVar7;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:1386:54)>
  *location_00;
  OwnPromiseNode intermediate;
  socklen_t addrlen;
  void *continuationTracePtr;
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [8];
  AuthenticatedStream result;
  OwnPromiseNode local_170;
  int one;
  undefined4 uStack_164;
  Fault f;
  FixVoid<kj::AuthenticatedStream> local_d8;
  sockaddr_storage addr;
  
  pDVar7 = (Disposer *)CONCAT71(in_register_00000031,authenticated);
  addrlen = 0x80;
  local_1b0._8_8_ = this;
  while (iVar4 = accept4(*(int *)&pDVar7[1]._vptr_Disposer,(sockaddr *)&addr,&addrlen,0x80800),
        iVar4 < 0) {
    piVar5 = __errno_location();
    iVar4 = *piVar5;
    if (((0x2a < iVar4 - 0x47U) || ((0x68160000001U >> ((ulong)(iVar4 - 0x47U) & 0x3f) & 1) == 0))
       && (iVar4 != 4)) {
      if (iVar4 == 0xb) {
        UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)local_1a0);
        result.stream.ptr = (AsyncIoStream *)CONCAT71(result.stream.ptr._1_7_,in_DL);
        continuationTracePtr =
             kj::_::
             SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1386:54)>
             ::anon_class_16_2_d4b6dc1c_for_func::operator();
        pp_Var1 = ((SleepHooks *)((long)local_1a0 + 8))->_vptr_SleepHooks;
        result.stream.disposer = pDVar7;
        if (pp_Var1 == (_func_int **)0x0 || (ulong)((long)local_1a0 - (long)pp_Var1) < 0x30) {
          pvVar6 = operator_new(0x400);
          location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:1386:54)>
                         *)((long)pvVar6 + 0x3d0);
          ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::FdConnectionReceiver::acceptImpl(bool)::_lambda()_2_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::FdConnectionReceiver::acceptImpl(bool)::_lambda()_2_,void*&>
                    (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_1a0,
                     (anon_class_16_2_d4b6dc1c_for_func *)&result,&continuationTracePtr);
          *(void **)((long)pvVar6 + 0x3d8) = pvVar6;
        }
        else {
          ((SleepHooks *)((long)local_1a0 + 8))->_vptr_SleepHooks = (_func_int **)0x0;
          location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:1386:54)>
                         *)((long)local_1a0 + -0x30);
          ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::FdConnectionReceiver::acceptImpl(bool)::_lambda()_2_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::FdConnectionReceiver::acceptImpl(bool)::_lambda()_2_,void*&>
                    (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_1a0,
                     (anon_class_16_2_d4b6dc1c_for_func *)&result,&continuationTracePtr);
          *(_func_int ***)((long)local_1a0 + -0x28) = pp_Var1;
        }
        f.exception = (Exception *)&DAT_003d3151;
        location.function = &DAT_003d31b0;
        location.fileName = &DAT_003d3151;
        location.lineNumber = 0x58b;
        location.columnNumber = 0x4c;
        intermediate.ptr = (PromiseNode *)location_00;
        kj::_::maybeChain<kj::AuthenticatedStream>
                  (&local_170,(Promise<kj::AuthenticatedStream> *)&intermediate,location);
        OVar2.ptr = (PromiseNode *)local_170;
        local_170.ptr = (PromiseNode *)0x0;
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_170);
        *(PromiseNode **)local_1b0._8_8_ = OVar2.ptr;
        _one = (PromiseFulfiller<void> *)0x0;
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                  ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&one);
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate);
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                  ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_1a0);
        return (Promise<kj::AuthenticatedStream>)(PromiseNode *)local_1b0._8_8_;
      }
      kj::_::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x580,iVar4,"accept","");
      kj::_::Debug::Fault::fatal(&f);
    }
  }
  intermediate.ptr._0_4_ = iVar4;
  cVar3 = (**(code **)*pDVar7[4]._vptr_Disposer)(pDVar7[4]._vptr_Disposer,&addr,addrlen);
  if (cVar3 == '\0') {
    acceptImpl((FdConnectionReceiver *)local_1b0._8_8_,authenticated);
  }
  else {
    one = 1;
    do {
      iVar4 = ::setsockopt((int)intermediate.ptr,6,1,&one,4);
      if (-1 < iVar4) goto LAB_0038f6ca;
      iVar4 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar4 == -1);
    if (((iVar4 != 0) && (iVar4 != 0x5c)) && (iVar4 != 0x5f)) {
      kj::_::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x555,iVar4,"setsocketopt(IPPROTO_TCP, TCP_NODELAY)","");
      kj::_::Debug::Fault::fatal(&f);
    }
LAB_0038f6ca:
    result.peerIdentity.disposer = (Disposer *)0x0;
    result.peerIdentity.ptr = (PeerIdentity *)0x0;
    result.stream.disposer = (Disposer *)0x0;
    result.stream.ptr = (AsyncIoStream *)0x0;
    eventPort = (UnixEventPort *)pDVar7[3]._vptr_Disposer;
    iVar4 = (int)intermediate.ptr;
    intermediate.ptr._0_4_ = 0xffffffff;
    this_00 = (AsyncStreamFd *)operator_new(0xa8);
    AsyncStreamFd::AsyncStreamFd(this_00,eventPort,iVar4,7,3);
    continuationTracePtr = &kj::_::HeapDisposer<kj::(anonymous_namespace)::AsyncStreamFd>::instance;
    f.exception = (Exception *)
                  &kj::_::HeapDisposer<kj::(anonymous_namespace)::AsyncStreamFd>::instance;
    local_1b0._0_8_ = (AsyncStreamFd *)0x0;
    Own<kj::AsyncIoStream,_std::nullptr_t>::operator=
              (&result.stream,(Own<kj::AsyncIoStream,_std::nullptr_t> *)&f);
    Own<kj::AsyncIoStream,_std::nullptr_t>::dispose((Own<kj::AsyncIoStream,_std::nullptr_t> *)&f);
    Own<kj::(anonymous_namespace)::AsyncStreamFd,_std::nullptr_t>::~Own
              ((Own<kj::(anonymous_namespace)::AsyncStreamFd,_std::nullptr_t> *)
               &continuationTracePtr);
    if (in_DL != '\0') {
      SocketAddress::SocketAddress((SocketAddress *)&f,&addr,addrlen);
      SocketAddress::getIdentity
                ((SocketAddress *)&continuationTracePtr,(LowLevelAsyncIoProvider *)&f,
                 (NetworkFilter *)pDVar7[2]._vptr_Disposer,(AsyncIoStream *)pDVar7[4]._vptr_Disposer
                );
      Own<kj::PeerIdentity,_std::nullptr_t>::operator=
                (&result.peerIdentity,(Own<kj::PeerIdentity,_std::nullptr_t> *)&continuationTracePtr
                );
      Own<kj::PeerIdentity,_std::nullptr_t>::dispose
                ((Own<kj::PeerIdentity,_std::nullptr_t> *)&continuationTracePtr);
    }
    local_d8.stream.disposer = result.stream.disposer;
    local_d8.stream.ptr = result.stream.ptr;
    result.stream.ptr = (AsyncIoStream *)0x0;
    local_d8.peerIdentity.disposer = result.peerIdentity.disposer;
    local_d8.peerIdentity.ptr = result.peerIdentity.ptr;
    result.peerIdentity.ptr = (PeerIdentity *)0x0;
    Promise<kj::AuthenticatedStream>::Promise
              ((Promise<kj::AuthenticatedStream> *)local_1b0._8_8_,&local_d8);
    AuthenticatedStream::~AuthenticatedStream(&local_d8);
    AuthenticatedStream::~AuthenticatedStream(&result);
  }
  OwnFd::~OwnFd((OwnFd *)&intermediate);
  return (Promise<kj::AuthenticatedStream>)(PromiseNode *)local_1b0._8_8_;
}

Assistant:

Promise<AuthenticatedStream> acceptImpl(bool authenticated) {
    int newFd;

    struct sockaddr_storage addr;
    socklen_t addrlen = sizeof(addr);

  retry:
#if __linux__ && !__BIONIC__
    newFd = ::accept4(fd, reinterpret_cast<struct sockaddr*>(&addr), &addrlen,
                      SOCK_NONBLOCK | SOCK_CLOEXEC);
#else
    newFd = ::accept(fd, reinterpret_cast<struct sockaddr*>(&addr), &addrlen);
#endif

    if (newFd >= 0) {
      kj::OwnFd ownFd(newFd);
      if (!filter.shouldAllow(reinterpret_cast<struct sockaddr*>(&addr), addrlen)) {
        // Ignore disallowed address.
        return acceptImpl(authenticated);
      } else {
        // TODO(perf):  As a hack for the 0.4 release we are always setting
        //   TCP_NODELAY because Nagle's algorithm pretty much kills Cap'n Proto's
        //   RPC protocol.  Later, we should extend the interface to provide more
        //   control over this.  Perhaps write() should have a flag which
        //   specifies whether to pass MSG_MORE.
        int one = 1;
        KJ_SYSCALL_HANDLE_ERRORS(::setsockopt(
              ownFd.get(), IPPROTO_TCP, TCP_NODELAY, (char*)&one, sizeof(one))) {
          case EOPNOTSUPP:
          case ENOPROTOOPT: // (returned for AF_UNIX in cygwin)
#if __FreeBSD__
          case EINVAL: // (returned for AF_UNIX in FreeBSD)
#endif
            break;
          default:
            KJ_FAIL_SYSCALL("setsocketopt(IPPROTO_TCP, TCP_NODELAY)", error);
        }

        AuthenticatedStream result;
        result.stream = heap<AsyncStreamFd>(eventPort, ownFd.release(), NEW_FD_FLAGS,
                                            UnixEventPort::FdObserver::OBSERVE_READ_WRITE);
        if (authenticated) {
          result.peerIdentity = SocketAddress(reinterpret_cast<struct sockaddr*>(&addr), addrlen)
              .getIdentity(lowLevel, filter, *result.stream);
        }
        return kj::mv(result);
      }
    } else {
      int error = errno;

      switch (error) {
        case EAGAIN:
#if EAGAIN != EWOULDBLOCK
        case EWOULDBLOCK:
#endif
          // Not ready yet.
          return observer.whenBecomesReadable().then([this,authenticated]() {
            return acceptImpl(authenticated);
          });

        case EINTR:
        case ENETDOWN:
#ifdef EPROTO
        // EPROTO is not defined on OpenBSD.
        case EPROTO:
#endif
        case EHOSTDOWN:
        case EHOSTUNREACH:
        case ENETUNREACH:
        case ECONNABORTED:
        case ETIMEDOUT:
          // According to the Linux man page, accept() may report an error if the accepted
          // connection is already broken.  In this case, we really ought to just ignore it and
          // keep waiting.  But it's hard to say exactly what errors are such network errors and
          // which ones are permanent errors.  We've made a guess here.
          goto retry;

        default:
          KJ_FAIL_SYSCALL("accept", error);
      }

    }
  }